

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O3

int ON_DBL::Compare(double *lhs,double *rhs)

{
  double dVar1;
  double dVar2;
  int iVar3;
  
  iVar3 = 0;
  if (((lhs != rhs) && (iVar3 = 1, lhs != (double *)0x0)) && (iVar3 = -1, rhs != (double *)0x0)) {
    dVar1 = *lhs;
    dVar2 = *rhs;
    if (dVar2 <= dVar1) {
      iVar3 = 1;
      if ((dVar1 <= dVar2) && ((iVar3 = 0, dVar1 != dVar2 || (NAN(dVar1) || NAN(dVar2))))) {
        iVar3 = (uint)NAN(dVar1) - (uint)NAN(dVar2);
      }
    }
  }
  return iVar3;
}

Assistant:

int ON_DBL::Compare(const double* lhs, const double* rhs)
{
  // sort nullptr to the end
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  return ON_DBL::CompareValue(*lhs, *rhs);
}